

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddCols(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *set,bool scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  Item *pIVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  undefined8 *puVar10;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  pointer pnVar15;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar16;
  undefined8 *puVar17;
  soplex *psVar18;
  uint *puVar19;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar20;
  Item *pIVar21;
  long lVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  ulong uVar24;
  int iVar25;
  long in_FS_OFFSET;
  byte bVar26;
  DataArray<int> local_428;
  DataArray<int> *local_410;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_408;
  DataKey local_400;
  undefined4 local_3f8;
  uint uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  double local_3e8;
  undefined8 uStack_3e0;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_3d8;
  soplex local_230 [112];
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  soplex local_1b0 [112];
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  soplex local_130 [112];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  soplex local_b0 [112];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar26 = 0;
  iVar1 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  lVar9 = (long)iVar1;
  iVar2 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_428.data = (int *)0x0;
  local_428.memFactor = 1.2;
  local_428.thesize = 0;
  if (0 < iVar2) {
    local_428.thesize = iVar2;
  }
  local_428.themax = 1;
  if (0 < iVar2) {
    local_428.themax = local_428.thesize;
  }
  spx_alloc<int*>(&local_428.data,local_428.themax);
  if (&this->
       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      != set) {
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(&this->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ,set);
  }
  lVar12 = (long)(this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (0 < lVar12) {
    memset(local_428.data,0,lVar12 << 2);
  }
  lVar12 = (long)(set->
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).set.thenum;
  if (0 < lVar12) {
    do {
      pIVar21 = (set->
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).set.theitem;
      iVar25 = (set->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).set.thekey[lVar12 + -1].idx;
      lVar22 = (long)pIVar21[iVar25].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
      if (0 < lVar22) {
        do {
          iVar3 = pIVar21[iVar25].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem[lVar22 + -1].idx;
          if ((this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum <= iVar3) {
            LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::LPRowBase(&local_3d8,0);
            DataArray<int>::reSize(&local_428,iVar3 + 1);
            iVar14 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
            lVar13 = (long)iVar14;
            if (iVar14 <= iVar3) {
              iVar14 = (iVar3 - iVar14) + 1;
              do {
                local_428.data[lVar13] = 0;
                local_400.info = 0;
                local_400.idx = -1;
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add(&this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,&local_400,&local_3d8);
                lVar13 = lVar13 + 1;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
            local_3d8.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
            if (local_3d8.vec.theelem !=
                (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
              free(local_3d8.vec.theelem);
            }
          }
          local_428.data[iVar3] = local_428.data[iVar3] + 1;
          bVar7 = 1 < lVar22;
          lVar22 = lVar22 + -1;
        } while (bVar7);
      }
      bVar7 = 1 < lVar12;
      lVar12 = lVar12 + -1;
    } while (bVar7);
  }
  iVar25 = (this->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  if (0 < iVar25) {
    lVar12 = 0;
    do {
      if (0 < local_428.data[lVar12]) {
        pIVar21 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar12].idx;
        iVar25 = local_428.data[lVar12] +
                 (pIVar21->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::xtend((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)this,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)pIVar21,iVar25);
        (this->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.theitem
        [(this->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thekey[lVar12].idx].data.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused = iVar25;
        iVar25 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar25);
  }
  iVar25 = (this->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  if (iVar1 < iVar25) {
    local_410 = &(this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).scaleExp;
    local_3e8 = *(double *)(in_FS_OFFSET + -8);
    local_3f8 = SUB84(local_3e8,0);
    uStack_3e0 = 0;
    uStack_3f4 = (uint)((ulong)local_3e8 >> 0x20) ^ 0x80000000;
    uStack_3f0 = 0;
    uStack_3ec = 0x80000000;
    local_408 = this;
    do {
      if (this->thesense == MAXIMIZE) {
        local_3d8.left.m_backend.data._M_elems[0] = 1;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
        ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                      *)((this->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9),(int *)&local_3d8);
      }
      else {
        local_3d8.left.m_backend.data._M_elems[0] = 0xffffffff;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
        ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                      *)((this->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9),(int *)&local_3d8);
      }
      pIVar21 = (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar9].idx;
      uVar8 = 0;
      if (scale) {
        uVar8 = (*this->lp_scaler->_vptr_SPxScaler[1])(this->lp_scaler,pIVar21,local_410);
        pcVar23 = &(this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar9].m_backend;
        ::soplex::infinity::__tls_init();
        local_3d8.left.m_backend.fpclass = cpp_dec_float_finite;
        local_3d8.left.m_backend.prec_elem = 0x1c;
        local_3d8.left.m_backend.data._M_elems[0] = 0;
        local_3d8.left.m_backend.data._M_elems[1] = 0;
        local_3d8.left.m_backend.data._M_elems[2] = 0;
        local_3d8.left.m_backend.data._M_elems[3] = 0;
        local_3d8.left.m_backend.data._M_elems[4] = 0;
        local_3d8.left.m_backend.data._M_elems[5] = 0;
        local_3d8.left.m_backend.data._M_elems[6] = 0;
        local_3d8.left.m_backend.data._M_elems[7] = 0;
        local_3d8.left.m_backend.data._M_elems[8] = 0;
        local_3d8.left.m_backend.data._M_elems[9] = 0;
        local_3d8.left.m_backend.data._M_elems[10] = 0;
        local_3d8.left.m_backend.data._M_elems[0xb] = 0;
        local_3d8.left.m_backend.data._M_elems[0xc] = 0;
        local_3d8.left.m_backend.data._M_elems[0xd] = 0;
        local_3d8.left.m_backend.data._M_elems[0xe] = 0;
        local_3d8.left.m_backend.data._M_elems[0xf] = 0;
        local_3d8.left.m_backend.data._M_elems[0x10] = 0;
        local_3d8.left.m_backend.data._M_elems[0x11] = 0;
        local_3d8.left.m_backend.data._M_elems[0x12] = 0;
        local_3d8.left.m_backend.data._M_elems[0x13] = 0;
        local_3d8.left.m_backend.data._M_elems[0x14] = 0;
        local_3d8.left.m_backend.data._M_elems[0x15] = 0;
        local_3d8.left.m_backend.data._M_elems[0x16] = 0;
        local_3d8.left.m_backend.data._M_elems[0x17] = 0;
        local_3d8.left.m_backend.data._M_elems[0x18] = 0;
        local_3d8.left.m_backend.data._M_elems[0x19] = 0;
        local_3d8.left.m_backend.data._M_elems._104_5_ = 0;
        local_3d8.left.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_3d8.left.m_backend.exp = 0;
        local_3d8.left.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3d8,local_3e8);
        if ((pcVar23->fpclass != cpp_dec_float_NaN) &&
           (local_3d8.left.m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (pcVar23,(cpp_dec_float<200U,_int,_void> *)&local_3d8);
          if (iVar25 < 0) {
            pnVar4 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar15 = pnVar4 + lVar9;
            psVar18 = local_b0;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *(undefined4 *)psVar18 = (pnVar15->m_backend).data._M_elems[0];
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar26 * -2 + 1) * 4);
              psVar18 = psVar18 + (ulong)bVar26 * -8 + 4;
            }
            local_40 = pnVar4[lVar9].m_backend.exp;
            local_3c = pnVar4[lVar9].m_backend.neg;
            local_38._0_4_ = pnVar4[lVar9].m_backend.fpclass;
            local_38._4_4_ = pnVar4[lVar9].m_backend.prec_elem;
            spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_3d8,local_b0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(ulong)-uVar8,CONCAT31((int3)((uint)local_40 >> 8),local_3c));
            pnVar4 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pLVar16 = &local_3d8;
            pnVar15 = pnVar4 + lVar9;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar15->m_backend).data._M_elems[0] = (pLVar16->left).m_backend.data._M_elems[0];
              pLVar16 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pLVar16 + ((ulong)bVar26 * -2 + 1) * 4);
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar26 * -2 + 1) * 4);
            }
            pnVar4[lVar9].m_backend.exp = local_3d8.left.m_backend.exp;
            pnVar4[lVar9].m_backend.neg = local_3d8.left.m_backend.neg;
            pnVar4[lVar9].m_backend.fpclass = local_3d8.left.m_backend.fpclass;
            pnVar4[lVar9].m_backend.prec_elem = local_3d8.left.m_backend.prec_elem;
          }
        }
        pcVar23 = &(this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar9].m_backend;
        ::soplex::infinity::__tls_init();
        local_3d8.left.m_backend.fpclass = cpp_dec_float_finite;
        local_3d8.left.m_backend.prec_elem = 0x1c;
        local_3d8.left.m_backend.data._M_elems[0] = 0;
        local_3d8.left.m_backend.data._M_elems[1] = 0;
        local_3d8.left.m_backend.data._M_elems[2] = 0;
        local_3d8.left.m_backend.data._M_elems[3] = 0;
        local_3d8.left.m_backend.data._M_elems[4] = 0;
        local_3d8.left.m_backend.data._M_elems[5] = 0;
        local_3d8.left.m_backend.data._M_elems[6] = 0;
        local_3d8.left.m_backend.data._M_elems[7] = 0;
        local_3d8.left.m_backend.data._M_elems[8] = 0;
        local_3d8.left.m_backend.data._M_elems[9] = 0;
        local_3d8.left.m_backend.data._M_elems[10] = 0;
        local_3d8.left.m_backend.data._M_elems[0xb] = 0;
        local_3d8.left.m_backend.data._M_elems[0xc] = 0;
        local_3d8.left.m_backend.data._M_elems[0xd] = 0;
        local_3d8.left.m_backend.data._M_elems[0xe] = 0;
        local_3d8.left.m_backend.data._M_elems[0xf] = 0;
        local_3d8.left.m_backend.data._M_elems[0x10] = 0;
        local_3d8.left.m_backend.data._M_elems[0x11] = 0;
        local_3d8.left.m_backend.data._M_elems[0x12] = 0;
        local_3d8.left.m_backend.data._M_elems[0x13] = 0;
        local_3d8.left.m_backend.data._M_elems[0x14] = 0;
        local_3d8.left.m_backend.data._M_elems[0x15] = 0;
        local_3d8.left.m_backend.data._M_elems[0x16] = 0;
        local_3d8.left.m_backend.data._M_elems[0x17] = 0;
        local_3d8.left.m_backend.data._M_elems[0x18] = 0;
        local_3d8.left.m_backend.data._M_elems[0x19] = 0;
        local_3d8.left.m_backend.data._M_elems._104_5_ = 0;
        local_3d8.left.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_3d8.left.m_backend.exp = 0;
        local_3d8.left.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3d8,(double)CONCAT44(uStack_3f4,local_3f8)
                  );
        if ((pcVar23->fpclass != cpp_dec_float_NaN) &&
           (local_3d8.left.m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar25 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (pcVar23,(cpp_dec_float<200U,_int,_void> *)&local_3d8);
          if (0 < iVar25) {
            pnVar4 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar15 = pnVar4 + lVar9;
            psVar18 = local_130;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *(undefined4 *)psVar18 = (pnVar15->m_backend).data._M_elems[0];
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar26 * -2 + 1) * 4);
              psVar18 = psVar18 + (ulong)bVar26 * -8 + 4;
            }
            local_c0 = pnVar4[lVar9].m_backend.exp;
            local_bc = pnVar4[lVar9].m_backend.neg;
            local_b8._0_4_ = pnVar4[lVar9].m_backend.fpclass;
            local_b8._4_4_ = pnVar4[lVar9].m_backend.prec_elem;
            spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_3d8,local_130,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(ulong)-uVar8,CONCAT31((int3)((uint)local_c0 >> 8),local_bc));
            pnVar4 = (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pLVar16 = &local_3d8;
            pnVar15 = pnVar4 + lVar9;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar15->m_backend).data._M_elems[0] = (pLVar16->left).m_backend.data._M_elems[0];
              pLVar16 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pLVar16 + ((ulong)bVar26 * -2 + 1) * 4);
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar26 * -2 + 1) * 4);
            }
            pnVar4[lVar9].m_backend.exp = local_3d8.left.m_backend.exp;
            pnVar4[lVar9].m_backend.neg = local_3d8.left.m_backend.neg;
            pnVar4[lVar9].m_backend.fpclass = local_3d8.left.m_backend.fpclass;
            pnVar4[lVar9].m_backend.prec_elem = local_3d8.left.m_backend.prec_elem;
          }
        }
        pnVar4 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar15 = pnVar4 + lVar9;
        psVar18 = local_1b0;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          *(undefined4 *)psVar18 = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar26 * -2 + 1) * 4);
          psVar18 = psVar18 + (ulong)bVar26 * -8 + 4;
        }
        local_140 = pnVar4[lVar9].m_backend.exp;
        local_13c = pnVar4[lVar9].m_backend.neg;
        local_138._0_4_ = pnVar4[lVar9].m_backend.fpclass;
        local_138._4_4_ = pnVar4[lVar9].m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_3d8,local_1b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)uVar8,CONCAT31((int3)((uint)local_140 >> 8),local_13c));
        pnVar4 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar16 = &local_3d8;
        pnVar15 = pnVar4 + lVar9;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pnVar15->m_backend).data._M_elems[0] = (pLVar16->left).m_backend.data._M_elems[0];
          pLVar16 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pLVar16 + ((ulong)bVar26 * -2 + 1) * 4);
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar26 * -2 + 1) * 4);
        }
        pnVar4[lVar9].m_backend.exp = local_3d8.left.m_backend.exp;
        pnVar4[lVar9].m_backend.neg = local_3d8.left.m_backend.neg;
        pnVar4[lVar9].m_backend.fpclass = local_3d8.left.m_backend.fpclass;
        pnVar4[lVar9].m_backend.prec_elem = local_3d8.left.m_backend.prec_elem;
        (this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).scaleExp.data[lVar9] = uVar8;
      }
      lVar12 = (long)(pIVar21->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
      if (0 < lVar12) {
        uVar24 = lVar12 + 1;
        lVar12 = lVar12 * 0x84 + -0xc;
        do {
          pNVar11 = (pIVar21->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          iVar25 = *(int *)((long)(pNVar11->val).m_backend.data._M_elems + lVar12 + 8);
          pIVar5 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem;
          iVar3 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[iVar25].idx;
          lVar22 = (long)pIVar5[iVar3].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused - (long)local_428.data[iVar25];
          local_428.data[iVar25] = local_428.data[iVar25] + -1;
          pNVar20 = pIVar5[iVar3].data.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          pNVar20[lVar22].idx = (int)lVar9;
          if (scale) {
            puVar10 = (undefined8 *)((long)(pNVar11->val).m_backend.data._M_elems + lVar12);
            puVar17 = puVar10 + -0xf;
            psVar18 = local_230;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *(undefined4 *)psVar18 = *(undefined4 *)puVar17;
              puVar17 = (undefined8 *)((long)puVar17 + (ulong)bVar26 * -8 + 4);
              psVar18 = psVar18 + (ulong)bVar26 * -8 + 4;
            }
            local_1c0 = *(undefined4 *)(puVar10 + -1);
            local_1bc = *(undefined1 *)((long)puVar10 + -4);
            local_1b8 = *puVar10;
            spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_3d8,local_230,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(ulong)((this->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).scaleExp.data[iVar25] + uVar8),
                       CONCAT31((int3)((uint)local_1c0 >> 8),local_1bc));
            puVar17 = (undefined8 *)
                      ((long)(((pIVar21->data).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem)->val).m_backend.data._M_elems + lVar12);
            pLVar16 = &local_3d8;
            puVar19 = (uint *)(puVar17 + -0xf);
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              *puVar19 = (pLVar16->left).m_backend.data._M_elems[0];
              pLVar16 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pLVar16 + ((ulong)bVar26 * -2 + 1) * 4);
              puVar19 = puVar19 + (ulong)bVar26 * -2 + 1;
            }
            *(int *)(puVar17 + -1) = local_3d8.left.m_backend.exp;
            *(bool *)((long)puVar17 + -4) = local_3d8.left.m_backend.neg;
            *puVar17 = local_3d8.left.m_backend._120_8_;
            pNVar11 = (pIVar21->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            pNVar20 = pIVar5[iVar3].data.
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            this = local_408;
          }
          puVar10 = (undefined8 *)((long)(pNVar11->val).m_backend.data._M_elems + lVar12);
          puVar17 = puVar10 + -0xf;
          pNVar11 = pNVar20 + lVar22;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pNVar11->val).m_backend.data._M_elems[0] = *(undefined4 *)puVar17;
            puVar17 = (undefined8 *)((long)puVar17 + (ulong)bVar26 * -8 + 4);
            pNVar11 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pNVar11 + ((ulong)bVar26 * -2 + 1) * 4);
          }
          pNVar20[lVar22].val.m_backend.exp = *(int *)(puVar10 + -1);
          pNVar20[lVar22].val.m_backend.neg = *(bool *)((long)puVar10 + -4);
          uVar6 = *puVar10;
          pNVar20[lVar22].val.m_backend.fpclass = (int)uVar6;
          pNVar20[lVar22].val.m_backend.prec_elem = (int)((ulong)uVar6 >> 0x20);
          uVar24 = uVar24 - 1;
          lVar12 = lVar12 + -0x84;
        } while (1 < uVar24);
      }
      lVar9 = lVar9 + 1;
      iVar25 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
    } while (lVar9 < iVar25);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])(this,(ulong)(uint)(iVar25 - iVar1));
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - iVar2));
  if (local_428.data != (int *)0x0) {
    free(local_428.data);
  }
  return;
}

Assistant:

void doAddCols(const LPColSetBase<R>& set, bool scale = false)
   {
      int i, j;
      int oldColNumber = nCols();
      int oldRowNumber = nRows();
      DataArray < int > newRows(nRows());

      if(&set != this)
         LPColSetBase<R>::add(set);

      assert(LPColSetBase<R>::isConsistent());
      assert(LPRowSetBase<R>::isConsistent());

      // count additional nonzeros per row
      for(i = nRows() - 1; i >= 0; --i)
         newRows[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.colVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new rows if required
            int l = vec.index(j);

            if(l >= nRows())
            {
               LPRowBase<R> empty;
               newRows.reSize(l + 1);

               for(int k = nRows(); k <= l; ++k)
               {
                  newRows[k] = 0;
                  LPRowSetBase<R>::add(empty);
               }

            }

            assert(l < nRows());
            newRows[l]++;
         }
      }

      // extend rows as required
      for(i = 0; i < nRows(); ++i)
      {
         if(newRows[i] > 0)
         {
            int len = newRows[i] + rowVector(i).size();
            LPRowSetBase<R>::xtend(i, len);
            rowVector_w(i).set_size(len);
         }
      }

      // insert new elements to row file
      for(i = oldColNumber; i < nCols(); ++i)
      {
         // @todo: Is there a better way to write the following if, else?
         if(thesense == MAXIMIZE)
         {
            LPColSetBase<R>::maxObj_w(i) *= 1;
         }
         else                  // thesense is MINIMIZE = -1
         {
            LPColSetBase<R>::maxObj_w(i) *= -1;
         }

         SVectorBase<R>& vec = colVector_w(i);
         int newColScaleExp = 0;

         DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

         // compute new column scaling factor and apply it to the bounds
         if(scale)
         {
            newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

            if(upper(i) < R(infinity))
               upper_w(i) = spxLdexp(upper_w(i), - newColScaleExp);

            if(lower(i) > R(-infinity))
               lower_w(i) = spxLdexp(lower_w(i), - newColScaleExp);

            maxObj_w(i) = spxLdexp(maxObj_w(i), newColScaleExp);

            LPColSetBase<R>::scaleExp[i] = newColScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            SVectorBase<R>& row = rowVector_w(k);
            int idx = row.size() - newRows[k];
            assert(newRows[k] > 0);
            newRows[k]--;
            row.index(idx) = i;

            // apply new column and existing row scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[k]);

            row.value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nRows(); ++i)
         assert(newRows[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nCols() - oldColNumber);
      addedCols(nCols() - oldColNumber);
      addedRows(nRows() - oldRowNumber);
   }